

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int execute_op(int a,int b,char operator)

{
  double dVar1;
  char operator_local;
  int b_local;
  int a_local;
  
  switch(operator) {
  case '%':
    b_local = a % b;
    break;
  case '&':
    b_local = a & b;
    break;
  default:
    printf("Unknown operator: \'%c\'\n",(ulong)(uint)(int)operator);
    b_local = 0;
    break;
  case '*':
    b_local = a * b;
    break;
  case '+':
    b_local = a + b;
    break;
  case '-':
    b_local = a - b;
    break;
  case '/':
    b_local = a / b;
    break;
  case '<':
    b_local = (int)(a < b);
    break;
  case '=':
    b_local = (int)(a == b);
    break;
  case '>':
    b_local = (int)(b < a);
    break;
  case '^':
    dVar1 = pow((double)a,(double)b);
    b_local = (int)dVar1;
    break;
  case '|':
    b_local = a | b;
    break;
  case '~':
    b_local = a ^ b;
  }
  return b_local;
}

Assistant:

int execute_op(const int a, const int b, const char operator) {
  switch (operator) {
    case '+': return a + b;
    case '-': return a - b;
    case '*': return a * b;
    case '/': return a / b;
    case '%': return a % b;
    case '<': return a < b;
    case '>': return a > b;
    case '=': return a == b;
    case '^': return (int)(pow((double)a, (double)b));
    case '|': return a | b;
    case '&': return a & b;
    case '~': return a ^ b;
    default:
      printf("Unknown operator: '%c'\n", operator);
      return 0;
  }
}